

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseScript(TidyDocImpl *doc,Node *script,GetTokenMode mode)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  doc->lexer->parent = script;
  pNVar2 = prvTidyGetToken(doc,CdataContent);
  doc->lexer->parent = (Node *)0x0;
  if (pNVar2 == (Node *)0x0) goto LAB_0013fb22;
  pNVar2->parent = script;
  if (script == (Node *)0x0) {
    pNVar2->prev = (Node *)0x0;
LAB_0013fab0:
    if (script != (Node *)0x0) {
      ppNVar3 = &script->content;
      goto LAB_0013fab9;
    }
  }
  else {
    pNVar1 = script->last;
    pNVar2->prev = pNVar1;
    if (pNVar1 == (Node *)0x0) goto LAB_0013fab0;
    ppNVar3 = &pNVar1->next;
LAB_0013fab9:
    *ppNVar3 = pNVar2;
    if (script != (Node *)0x0) {
      script->last = pNVar2;
    }
  }
  pNVar2 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar2 != (Node *)0x0) {
    if (((pNVar2->type == EndTag) && (pNVar2->tag != (Dict *)0x0)) &&
       (pNVar2->tag->id == script->tag->id)) {
      prvTidyFreeNode(doc,pNVar2);
      return (Node *)0x0;
    }
    prvTidyReport(doc,script,pNVar2,0x25a);
    prvTidyUngetToken(doc);
    return (Node *)0x0;
  }
LAB_0013fb22:
  prvTidyReport(doc,script,(Node *)0x0,0x25a);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseScript)( TidyDocImpl* doc, Node *script, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
#if defined(ENABLE_DEBUG_LOG)
    static int depth_parser = 0;
    static int count_parser = 0;
#endif
    
    DEBUG_LOG_ENTER_WITH_NODE(script);
    
    doc->lexer->parent = script;
    node = TY_(GetToken)(doc, CdataContent);
    doc->lexer->parent = NULL;

    if (node)
    {
        TY_(InsertNodeAtEnd)(script, node);
    }
    else
    {
        /* handle e.g. a document like "<script>" */
        TY_(Report)(doc, script, NULL, MISSING_ENDTAG_FOR);
        DEBUG_LOG_EXIT;
        return NULL;
    }

    node = TY_(GetToken)(doc, IgnoreWhitespace);
    DEBUG_LOG_GOT_TOKEN(node);

    if (!(node && node->type == EndTag && node->tag &&
        node->tag->id == script->tag->id))
    {
        TY_(Report)(doc, script, node, MISSING_ENDTAG_FOR);

        if (node)
            TY_(UngetToken)(doc);
    }
    else
    {
        TY_(FreeNode)(doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}